

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool WindowedKeyTest<Blob<66>,unsigned_int>
               (hashfunc<unsigned_int> hash,int windowbits,bool testCollision,bool testDistribution,
               bool drawDiagram)

{
  byte in_CL;
  byte in_DL;
  uint in_ESI;
  byte in_R8B;
  int i;
  Blob<66> key;
  int minbit;
  int j;
  int testcount;
  bool result;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  int keycount;
  int keybits;
  bool in_stack_0000007b;
  bool in_stack_0000007c;
  bool in_stack_0000007d;
  bool in_stack_0000007e;
  bool in_stack_0000007f;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000080;
  int in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *blob;
  void *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  size_type in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint local_48;
  bool local_3d;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  uint local_18;
  undefined4 local_14;
  byte local_f;
  byte local_e;
  byte local_d;
  uint local_c;
  
  local_d = in_DL & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_14 = 0x48;
  local_18 = 1 << (in_ESI & 0x1f);
  blob = &local_30;
  local_c = in_ESI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x12ca6f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
            );
  local_3d = true;
  printf("Keyset \'Window\' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",0x48,
         (ulong)local_c,0x48,(ulong)local_18);
  for (local_48 = 0; (int)local_48 < 0x49; local_48 = local_48 + 1) {
    Blob<66>::Blob((Blob<66> *)&stack0xffffffffffffffab);
    for (in_stack_ffffffffffffffa4 = 0; in_stack_ffffffffffffffa4 < (int)local_18;
        in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 + 1) {
      Blob<66>::Blob((Blob<66> *)&stack0xffffffffffffff9b,in_stack_ffffffffffffffa4);
      Blob<66>::operator=((Blob<66> *)&stack0xffffffffffffffab,(Blob<66> *)&stack0xffffffffffffff9b)
      ;
      lrot(blob,CONCAT13(in_stack_ffffffffffffff8f,
                         CONCAT12(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff8c)),
           in_stack_ffffffffffffff88);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                (&local_30,(long)in_stack_ffffffffffffffa4);
      hashfunc<unsigned_int>::operator()
                ((hashfunc<unsigned_int> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff98,(int)((ulong)blob >> 0x20),(uint32_t)blob,
                 (uint32_t *)
                 CONCAT17(in_stack_ffffffffffffff8f,
                          CONCAT16(in_stack_ffffffffffffff8e,
                                   CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))));
    }
    printf("Window at %3d - ",(ulong)local_48);
    in_stack_ffffffffffffff8f =
         TestHashList<unsigned_int>
                   (in_stack_00000080,in_stack_0000007f,in_stack_0000007e,in_stack_0000007d,
                    in_stack_0000007c,in_stack_0000007b);
    local_3d = (local_3d & in_stack_ffffffffffffff8f) != 0;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  return (bool)(local_3d & 1);
}

Assistant:

bool WindowedKeyTest ( hashfunc<hashtype> hash, const int windowbits,
                       bool testCollision, bool testDistribution, bool drawDiagram )
{
  const int keybits = sizeof(keytype) * 8;
  const int keycount = 1 << windowbits;

  std::vector<hashtype> hashes;
  hashes.resize(keycount);

  bool result = true;

  int testcount = keybits;

  printf("Keyset 'Window' - %3d-bit key, %3d-bit window - %d tests, %d keys per test\n",
         keybits,windowbits,testcount,keycount);

  for(int j = 0; j <= testcount; j++)
  {
    int minbit = j;

    keytype key;

    for(int i = 0; i < keycount; i++)
    {
      key = i;
      //key = key << minbit;

      lrot(&key,sizeof(keytype),minbit);

      hash(&key,sizeof(keytype),0,&hashes[i]);
    }

    printf("Window at %3d - ",j);

    result &= TestHashList(hashes, drawDiagram, testCollision, testDistribution,
                           /* do not test high/low bits (to not clobber the screen) */
                           false, false);

    //printf("\n");
  }

  return result;
}